

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O2

long __thiscall
cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
::latency(cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
          *this)

{
  uint32_t uVar1;
  cubeb_resampler_speex_one_way<short> *this_00;
  
  this_00 = (this->input_processor)._M_t.
            super___uniq_ptr_impl<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<short>_*,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
            .super__Head_base<0UL,_cubeb_resampler_speex_one_way<short>_*,_false>._M_head_impl;
  if (this_00 == (cubeb_resampler_speex_one_way<short> *)0x0) {
    this_00 = (this->output_processor)._M_t.
              super___uniq_ptr_impl<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<short>_*,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
              .super__Head_base<0UL,_cubeb_resampler_speex_one_way<short>_*,_false>._M_head_impl;
  }
  uVar1 = cubeb_resampler_speex_one_way<short>::latency(this_00);
  return (ulong)uVar1;
}

Assistant:

virtual long latency()
  {
    if (input_processor && output_processor) {
      assert(input_processor->latency() == output_processor->latency());
      return input_processor->latency();
    } else if (input_processor) {
      return input_processor->latency();
    } else {
      return output_processor->latency();
    }
  }